

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Group_Type.cxx
# Opt level: O3

void group_cb(Fl_Widget *param_1,void *param_2)

{
  int iVar1;
  undefined4 extraout_var;
  Fl_Type *this;
  undefined4 extraout_var_00;
  Fl_Type *pFVar2;
  Fl_Type *__filename;
  
  pFVar2 = Fl_Type::current;
  do {
    if (pFVar2 == (Fl_Type *)0x0) {
LAB_0017ccd2:
      fl_message("Please select widgets to group");
      return;
    }
    iVar1 = (*pFVar2->_vptr_Fl_Type[0x17])(pFVar2);
    if (iVar1 != 0) {
      iVar1 = (*pFVar2->_vptr_Fl_Type[0x1e])(pFVar2);
      if (iVar1 == 0) {
        if (pFVar2->level < 1) goto LAB_0017ccd2;
        if (pFVar2->level == 1) {
          iVar1 = (*pFVar2->_vptr_Fl_Type[5])(pFVar2);
          iVar1 = strcmp((char *)CONCAT44(extraout_var,iVar1),"widget_class");
          if (iVar1 == 0) goto LAB_0017ccd2;
        }
        force_parent = 1;
        this = Fl_Widget_Type::make(&Fl_Group_type.super_Fl_Widget_Type);
        Fl_Type::move_before(this,pFVar2);
        pFVar2 = pFVar2[1].prev;
        __filename = (Fl_Type *)(ulong)*(uint *)&pFVar2->user_data_;
        (*(this[1].prev)->_vptr_Fl_Type[4])
                  (this[1].prev,__filename,(ulong)*(uint *)((long)&pFVar2->user_data_ + 4),
                   (ulong)*(uint *)&pFVar2->user_data_type_,
                   (ulong)*(uint *)((long)&pFVar2->user_data_type_ + 4));
        pFVar2 = Fl_Type::first;
        while (pFVar2 != (Fl_Type *)0x0) {
          if (((pFVar2 == this) || (pFVar2->level != this->level)) || (pFVar2->selected == '\0')) {
            pFVar2 = pFVar2->next;
          }
          else {
            iVar1 = Fl_Type::remove(pFVar2,(char *)__filename);
            __filename = this;
            Fl_Type::add(pFVar2,this);
            pFVar2 = (Fl_Type *)CONCAT44(extraout_var_00,iVar1);
          }
        }
        fix_group_size(this);
        return;
      }
    }
    pFVar2 = pFVar2->parent;
  } while( true );
}

Assistant:

void group_cb(Fl_Widget *, void *) {
  // Find the current widget:
  Fl_Type *qq = Fl_Type::current;
  while (qq && (!qq->is_widget() || qq->is_menu_item())) qq = qq->parent;
  if (!qq || qq->level < 1 || (qq->level == 1 && !strcmp(qq->type_name(), "widget_class"))) {
    fl_message("Please select widgets to group");
    return;
  }
  Fl_Widget_Type* q = (Fl_Widget_Type*)qq;
  force_parent = 1;
  Fl_Group_Type *n = (Fl_Group_Type*)(Fl_Group_type.make());
  n->move_before(q);
  n->o->resize(q->o->x(),q->o->y(),q->o->w(),q->o->h());
  for (Fl_Type *t = Fl_Type::first; t;) {
    if (t->level != n->level || t == n || !t->selected) {
      t = t->next; continue;}
    Fl_Type *nxt = t->remove();
    t->add(n);
    t = nxt;
  }
  fix_group_size(n);
}